

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

uint64_t celero::timer::GetSystemTime(void)

{
  long lVar1;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  return lVar1 / 1000;
}

Assistant:

uint64_t celero::timer::GetSystemTime()
{
#ifdef _WIN32
	LARGE_INTEGER timeStorage;
	QueryPerformanceCounter(&timeStorage);
	if(QPCFrequency.QuadPart != 0)
	{
		return static_cast<uint64_t>(timeStorage.QuadPart * 1000000) / static_cast<uint64_t>(QPCFrequency.QuadPart);
	}

	return 0;
#else
	auto timePoint = std::chrono::high_resolution_clock::now();
	return std::chrono::duration_cast<std::chrono::microseconds>(timePoint.time_since_epoch()).count();
#endif
}